

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
AddKel(TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
       *this,TPZFMatrix<long_double> *elmat,TPZVec<long> *destinationindex)

{
  TPZFrontNonSym<long_double> *this_00;
  int iVar1;
  TPZEqnArray<long_double> *this_01;
  int64_t maxeq;
  int64_t mineq;
  long local_38;
  long local_30;
  
  this_00 = &(this->
             super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
             ).fFront;
  TPZFrontNonSym<long_double>::AddKel(this_00,elmat,destinationindex);
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
  EquationsToDecompose
            (&this->
              super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
             ,destinationindex,&local_30,&local_38);
  if (local_30 <= local_38) {
    this_01 = (TPZEqnArray<long_double> *)operator_new(0x51e0);
    TPZEqnArray<long_double>::TPZEqnArray(this_01);
    TPZFrontNonSym<long_double>::DecomposeEquations(this_00,local_30,local_38,this_01);
    TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
    CheckCompress(&this->
                   super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                 );
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->fwritelock);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    (**(code **)(*(long *)&(this->
                           super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                           ).field_0x33488 + 0x18))
              (&(this->
                super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                ).field_0x33488,*(long *)&this->field_0x33498 + 1);
    *(TPZEqnArray<long_double> **)
     (*(long *)&this->field_0x33490 + -8 + *(long *)&this->field_0x33498 * 8) = this_01;
    if (local_38 ==
        (this->
        super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
        ).super_TPZAbstractFrontMatrix<long_double>.super_TPZMatrix<long_double>.super_TPZBaseMatrix
        .fRow + -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Decomposition finished",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
      std::ostream::flush();
      FinishWriting(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->fwritelock);
    std::condition_variable::notify_all();
  }
  (this->
  super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>).
  super_TPZAbstractFrontMatrix<long_double>.super_TPZMatrix<long_double>.super_TPZBaseMatrix.
  fDecomposed = (char)(this->
                      super_TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                      ).fFront.super_TPZFront<long_double>.fDecomposeType;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex)
{
	
	// message #1.3 to fFront:TPZFront
	this->fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif

	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);
	if(maxeq >= mineq) {

		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;
		
		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        {
            std::lock_guard<std::mutex> lock(fwritelock);
            fEqnStack.Push(AuxEqn);
            if(maxeq == this->Rows()-1){
                cout << "Decomposition finished" << endl;
                cout.flush();
                FinishWriting();
                //fStorage.ReOpen();
            }
        }
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}